

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O0

StringRef llvm::dwarf::ApplePropertyString(uint Prop)

{
  undefined1 auStack_18 [4];
  uint Prop_local;
  
  if (Prop == 1) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_APPLE_PROPERTY_readonly");
  }
  else if (Prop == 2) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_APPLE_PROPERTY_getter");
  }
  else if (Prop == 4) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_APPLE_PROPERTY_assign");
  }
  else if (Prop == 8) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_APPLE_PROPERTY_readwrite");
  }
  else if (Prop == 0x10) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_APPLE_PROPERTY_retain");
  }
  else if (Prop == 0x20) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_APPLE_PROPERTY_copy");
  }
  else if (Prop == 0x40) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_APPLE_PROPERTY_nonatomic");
  }
  else if (Prop == 0x80) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_APPLE_PROPERTY_setter");
  }
  else if (Prop == 0x100) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_APPLE_PROPERTY_atomic");
  }
  else if (Prop == 0x200) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_APPLE_PROPERTY_weak");
  }
  else if (Prop == 0x400) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_APPLE_PROPERTY_strong");
  }
  else if (Prop == 0x800) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_APPLE_PROPERTY_unsafe_unretained");
  }
  else if (Prop == 0x1000) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_APPLE_PROPERTY_nullability");
  }
  else if (Prop == 0x2000) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_APPLE_PROPERTY_null_resettable");
  }
  else if (Prop == 0x4000) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_APPLE_PROPERTY_class");
  }
  else {
    memset(auStack_18,0,0x10);
    StringRef::StringRef((StringRef *)auStack_18);
  }
  return _auStack_18;
}

Assistant:

StringRef llvm::dwarf::ApplePropertyString(unsigned Prop) {
  switch (Prop) {
  default:
    return StringRef();
#define HANDLE_DW_APPLE_PROPERTY(ID, NAME)                                     \
  case DW_APPLE_PROPERTY_##NAME:                                               \
    return "DW_APPLE_PROPERTY_" #NAME;
#include "llvm/BinaryFormat/Dwarf.def"
  }
}